

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_backup_step(sqlite3_backup *p,int nPage)

{
  int *piVar1;
  u8 uVar2;
  u32 uVar3;
  sqlite3_mutex *psVar4;
  Btree *pBVar5;
  BtShared *pBVar6;
  BtShared *pBVar7;
  Pager *pPVar8;
  sqlite3_file *psVar9;
  uint uVar10;
  uint uVar11;
  int iVar12;
  Pgno PVar13;
  long lVar14;
  long lVar15;
  bool bVar16;
  bool bVar17;
  DbPage *pSrcPg;
  DbPage *local_60;
  Pager *local_58;
  u32 local_4c;
  long local_48;
  ulong local_40;
  Pager *local_38;
  
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  pBVar5 = p->pSrc;
  if ((pBVar5->sharable != '\0') &&
     (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
    btreeLockCarefully(pBVar5);
  }
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexEnter)(psVar4);
  }
  uVar11 = p->rc;
  if ((6 < uVar11) || ((0x61U >> (uVar11 & 0x1f) & 1) == 0)) goto LAB_001ec4ac;
  pBVar5 = p->pSrc;
  local_38 = pBVar5->pBt->pPager;
  local_58 = p->pDest->pBt->pPager;
  if ((p->pDestDb == (sqlite3 *)0x0) || (pBVar5->pBt->inTransaction != '\x02')) {
    uVar11 = 0;
    bVar16 = pBVar5->inTrans != '\0';
    if (!bVar16) {
      uVar11 = sqlite3BtreeBeginTrans(pBVar5,0);
    }
    iVar12 = p->bDestLocked;
    if (iVar12 == 0 && uVar11 == 0) {
      iVar12 = sqlite3BtreeSetPageSize(p->pDest,p->pSrc->pBt->pageSize,-1,0);
      uVar11 = 7;
      if (iVar12 != 7) {
        iVar12 = p->bDestLocked;
LAB_001ec04b:
        uVar11 = 0;
        if ((iVar12 == 0) && (uVar11 = sqlite3BtreeBeginTrans(p->pDest,2), uVar11 == 0)) {
          p->bDestLocked = 1;
          sqlite3BtreeGetMeta(p->pDest,1,&p->iDestSchema);
          uVar11 = 0;
        }
      }
    }
    else if (uVar11 == 0) goto LAB_001ec04b;
  }
  else {
    bVar16 = true;
    uVar11 = 5;
  }
  pBVar6 = p->pSrc->pBt;
  uVar3 = pBVar6->pageSize;
  local_40 = (ulong)(int)uVar3;
  pBVar7 = p->pDest->pBt;
  local_4c = pBVar7->pageSize;
  uVar2 = pBVar7->pPager->journalMode;
  local_48 = CONCAT71(local_48._1_7_,uVar2);
  uVar10 = (uint)(uVar3 != local_4c) << 3;
  if (uVar2 != '\x05') {
    uVar10 = uVar11;
  }
  if (uVar11 != 0) {
    uVar10 = uVar11;
  }
  uVar11 = pBVar6->nPage;
  if (nPage != 0) {
    PVar13 = p->iNext;
    iVar12 = 1;
    do {
      if ((uVar11 < PVar13) || (uVar10 != 0)) break;
      uVar10 = 0;
      if (PVar13 != (uint)sqlite3PendingByte / p->pSrc->pBt->pageSize + 1) {
        uVar10 = (*local_38->xGet)(local_38,PVar13,&local_60,2);
        if ((uVar10 == 0) &&
           (uVar10 = backupOnePage(p,PVar13,(u8 *)local_60->pData,0), local_60 != (DbPage *)0x0)) {
          sqlite3PagerUnrefNotNull(local_60);
        }
        PVar13 = p->iNext;
      }
      PVar13 = PVar13 + 1;
      p->iNext = PVar13;
      bVar17 = iVar12 < nPage;
      iVar12 = iVar12 + 1;
    } while (bVar17 || nPage < 0);
  }
  if (uVar10 == 0x65) {
LAB_001ec197:
    if (uVar11 == 0) {
      pBVar5 = p->pDest;
      if ((pBVar5->sharable != '\0') &&
         (pBVar5->wantToLock = pBVar5->wantToLock + 1, pBVar5->locked == '\0')) {
        btreeLockCarefully(pBVar5);
      }
      pBVar6 = pBVar5->pBt;
      pBVar6->nPage = 0;
      uVar10 = newDatabase(pBVar6);
      if (pBVar5->sharable != '\0') {
        piVar1 = &pBVar5->wantToLock;
        *piVar1 = *piVar1 + -1;
        if (*piVar1 == 0) {
          unlockBtreeMutex(pBVar5);
        }
      }
      uVar11 = 1;
      if ((uVar10 != 0x65) && (uVar10 != 0)) goto LAB_001ec47c;
    }
    uVar10 = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema + 1);
    if (uVar10 == 0) {
      if (p->pDestDb != (sqlite3 *)0x0) {
        sqlite3ResetAllSchemasOfConnection(p->pDestDb);
      }
      if (((char)local_48 != '\x05') || (uVar10 = sqlite3BtreeSetVersion(p->pDest,2), uVar10 == 0))
      {
        iVar12 = (int)local_40;
        if (iVar12 < (int)local_4c) {
          iVar12 = (int)(uVar11 + (int)local_4c / iVar12 + -1) / ((int)local_4c / iVar12);
          PVar13 = iVar12 - (uint)(iVar12 == (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1)
          ;
          local_48 = (long)(int)uVar11 * local_40;
          psVar9 = local_58->fd;
          uVar11 = local_58->dbSize;
          if (uVar11 < PVar13) {
LAB_001ec346:
            lVar14 = local_48;
            uVar10 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,1);
          }
          else {
            do {
              uVar10 = 0;
              if (((PVar13 != (uint)sqlite3PendingByte / p->pDest->pBt->pageSize + 1) &&
                  (uVar10 = (*local_58->xGet)(local_58,PVar13,&local_60,0), uVar10 == 0)) &&
                 (uVar10 = sqlite3PagerWrite(local_60), local_60 != (DbPage *)0x0)) {
                sqlite3PagerUnrefNotNull(local_60);
              }
            } while ((uVar10 == 0) && (PVar13 = PVar13 + 1, PVar13 <= uVar11));
            lVar14 = local_48;
            if (uVar10 == 0) goto LAB_001ec346;
          }
          lVar15 = (long)(int)(local_4c + sqlite3PendingByte);
          if (lVar14 < (int)(local_4c + sqlite3PendingByte)) {
            lVar15 = lVar14;
          }
          bVar17 = uVar10 == 0;
          if ((bVar17) && (lVar14 = (long)(sqlite3PendingByte + (int)local_40), lVar14 < lVar15)) {
            do {
              local_60 = (DbPage *)0x0;
              uVar10 = (*local_38->xGet)(local_38,(int)(lVar14 / (long)local_40) + 1,&local_60,0);
              if (uVar10 == 0) {
                uVar10 = (*psVar9->pMethods->xWrite)(psVar9,local_60->pData,(int)local_40,lVar14);
              }
              if (local_60 != (DbPage *)0x0) {
                sqlite3PagerUnrefNotNull(local_60);
              }
              bVar17 = uVar10 == 0;
            } while ((bVar17) && (lVar14 = lVar14 + local_40, lVar14 < lVar15));
          }
          if (((!bVar17) ||
              (uVar10 = (*psVar9->pMethods->xFileSize)(psVar9,(sqlite3_int64 *)&local_60),
              uVar10 != 0)) ||
             ((local_48 < (long)local_60 &&
              (uVar10 = (*psVar9->pMethods->xTruncate)(psVar9,local_48), uVar10 != 0))))
          goto LAB_001ec47c;
          uVar10 = sqlite3PagerSync(local_58,(char *)0x0);
        }
        else {
          local_58->dbSize =
               (int)((long)((ulong)(uint)(iVar12 >> 0x1f) << 0x20 | local_40 & 0xffffffff) /
                    (long)(int)local_4c) * uVar11;
          uVar10 = sqlite3PagerCommitPhaseOne(local_58,(char *)0x0,0);
        }
        if (uVar10 == 0) {
          uVar11 = sqlite3BtreeCommitPhaseTwo(p->pDest,0);
          uVar10 = 0x65;
          if (uVar11 != 0) {
            uVar10 = uVar11;
          }
        }
      }
    }
  }
  else if (uVar10 == 0) {
    p->nPagecount = uVar11;
    p->nRemaining = (uVar11 - p->iNext) + 1;
    if (uVar11 < p->iNext) goto LAB_001ec197;
    uVar10 = 0;
    if (p->isAttached == 0) {
      pPVar8 = p->pSrc->pBt->pPager;
      p->pNext = pPVar8->pBackup;
      pPVar8->pBackup = p;
      p->isAttached = 1;
    }
  }
LAB_001ec47c:
  if (!bVar16) {
    sqlite3BtreeCommitPhaseOne(p->pSrc,(char *)0x0);
    sqlite3BtreeCommitPhaseTwo(p->pSrc,0);
  }
  uVar11 = 7;
  if (uVar10 != 0xc0a) {
    uVar11 = uVar10;
  }
  p->rc = uVar11;
LAB_001ec4ac:
  if ((p->pDestDb != (sqlite3 *)0x0) && (psVar4 = p->pDestDb->mutex, psVar4 != (sqlite3_mutex *)0x0)
     ) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  pBVar5 = p->pSrc;
  if (pBVar5->sharable != '\0') {
    piVar1 = &pBVar5->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(pBVar5);
    }
  }
  psVar4 = p->pSrcDb->mutex;
  if (psVar4 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar4);
  }
  return uVar11;
}

Assistant:

SQLITE_API int sqlite3_backup_step(sqlite3_backup *p, int nPage){
  int rc;
  int destMode;       /* Destination journal mode */
  int pgszSrc = 0;    /* Source page size */
  int pgszDest = 0;   /* Destination page size */

#ifdef SQLITE_ENABLE_API_ARMOR
  if( p==0 ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(p->pSrcDb->mutex);
  sqlite3BtreeEnter(p->pSrc);
  if( p->pDestDb ){
    sqlite3_mutex_enter(p->pDestDb->mutex);
  }

  rc = p->rc;
  if( !isFatalError(rc) ){
    Pager * const pSrcPager = sqlite3BtreePager(p->pSrc);     /* Source pager */
    Pager * const pDestPager = sqlite3BtreePager(p->pDest);   /* Dest pager */
    int ii;                            /* Iterator variable */
    int nSrcPage = -1;                 /* Size of source db in pages */
    int bCloseTrans = 0;               /* True if src db requires unlocking */

    /* If the source pager is currently in a write-transaction, return
    ** SQLITE_BUSY immediately.
    */
    if( p->pDestDb && p->pSrc->pBt->inTransaction==TRANS_WRITE ){
      rc = SQLITE_BUSY;
    }else{
      rc = SQLITE_OK;
    }

    /* If there is no open read-transaction on the source database, open
    ** one now. If a transaction is opened here, then it will be closed
    ** before this function exits.
    */
    if( rc==SQLITE_OK && 0==sqlite3BtreeIsInReadTrans(p->pSrc) ){
      rc = sqlite3BtreeBeginTrans(p->pSrc, 0);
      bCloseTrans = 1;
    }

    /* If the destination database has not yet been locked (i.e. if this
    ** is the first call to backup_step() for the current backup operation),
    ** try to set its page size to the same as the source database. This
    ** is especially important on ZipVFS systems, as in that case it is
    ** not possible to create a database file that uses one page size by
    ** writing to it with another.  */
    if( p->bDestLocked==0 && rc==SQLITE_OK && setDestPgsz(p)==SQLITE_NOMEM ){
      rc = SQLITE_NOMEM;
    }

    /* Lock the destination database, if it is not locked already. */
    if( SQLITE_OK==rc && p->bDestLocked==0
     && SQLITE_OK==(rc = sqlite3BtreeBeginTrans(p->pDest, 2)) 
    ){
      p->bDestLocked = 1;
      sqlite3BtreeGetMeta(p->pDest, BTREE_SCHEMA_VERSION, &p->iDestSchema);
    }

    /* Do not allow backup if the destination database is in WAL mode
    ** and the page sizes are different between source and destination */
    pgszSrc = sqlite3BtreeGetPageSize(p->pSrc);
    pgszDest = sqlite3BtreeGetPageSize(p->pDest);
    destMode = sqlite3PagerGetJournalMode(sqlite3BtreePager(p->pDest));
    if( SQLITE_OK==rc && destMode==PAGER_JOURNALMODE_WAL && pgszSrc!=pgszDest ){
      rc = SQLITE_READONLY;
    }
  
    /* Now that there is a read-lock on the source database, query the
    ** source pager for the number of pages in the database.
    */
    nSrcPage = (int)sqlite3BtreeLastPage(p->pSrc);
    assert( nSrcPage>=0 );
    for(ii=0; (nPage<0 || ii<nPage) && p->iNext<=(Pgno)nSrcPage && !rc; ii++){
      const Pgno iSrcPg = p->iNext;                 /* Source page number */
      if( iSrcPg!=PENDING_BYTE_PAGE(p->pSrc->pBt) ){
        DbPage *pSrcPg;                             /* Source page object */
        rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg,PAGER_GET_READONLY);
        if( rc==SQLITE_OK ){
          rc = backupOnePage(p, iSrcPg, sqlite3PagerGetData(pSrcPg), 0);
          sqlite3PagerUnref(pSrcPg);
        }
      }
      p->iNext++;
    }
    if( rc==SQLITE_OK ){
      p->nPagecount = nSrcPage;
      p->nRemaining = nSrcPage+1-p->iNext;
      if( p->iNext>(Pgno)nSrcPage ){
        rc = SQLITE_DONE;
      }else if( !p->isAttached ){
        attachBackupObject(p);
      }
    }
  
    /* Update the schema version field in the destination database. This
    ** is to make sure that the schema-version really does change in
    ** the case where the source and destination databases have the
    ** same schema version.
    */
    if( rc==SQLITE_DONE ){
      if( nSrcPage==0 ){
        rc = sqlite3BtreeNewDb(p->pDest);
        nSrcPage = 1;
      }
      if( rc==SQLITE_OK || rc==SQLITE_DONE ){
        rc = sqlite3BtreeUpdateMeta(p->pDest,1,p->iDestSchema+1);
      }
      if( rc==SQLITE_OK ){
        if( p->pDestDb ){
          sqlite3ResetAllSchemasOfConnection(p->pDestDb);
        }
        if( destMode==PAGER_JOURNALMODE_WAL ){
          rc = sqlite3BtreeSetVersion(p->pDest, 2);
        }
      }
      if( rc==SQLITE_OK ){
        int nDestTruncate;
        /* Set nDestTruncate to the final number of pages in the destination
        ** database. The complication here is that the destination page
        ** size may be different to the source page size. 
        **
        ** If the source page size is smaller than the destination page size, 
        ** round up. In this case the call to sqlite3OsTruncate() below will
        ** fix the size of the file. However it is important to call
        ** sqlite3PagerTruncateImage() here so that any pages in the 
        ** destination file that lie beyond the nDestTruncate page mark are
        ** journalled by PagerCommitPhaseOne() before they are destroyed
        ** by the file truncation.
        */
        assert( pgszSrc==sqlite3BtreeGetPageSize(p->pSrc) );
        assert( pgszDest==sqlite3BtreeGetPageSize(p->pDest) );
        if( pgszSrc<pgszDest ){
          int ratio = pgszDest/pgszSrc;
          nDestTruncate = (nSrcPage+ratio-1)/ratio;
          if( nDestTruncate==(int)PENDING_BYTE_PAGE(p->pDest->pBt) ){
            nDestTruncate--;
          }
        }else{
          nDestTruncate = nSrcPage * (pgszSrc/pgszDest);
        }
        assert( nDestTruncate>0 );

        if( pgszSrc<pgszDest ){
          /* If the source page-size is smaller than the destination page-size,
          ** two extra things may need to happen:
          **
          **   * The destination may need to be truncated, and
          **
          **   * Data stored on the pages immediately following the 
          **     pending-byte page in the source database may need to be
          **     copied into the destination database.
          */
          const i64 iSize = (i64)pgszSrc * (i64)nSrcPage;
          sqlite3_file * const pFile = sqlite3PagerFile(pDestPager);
          Pgno iPg;
          int nDstPage;
          i64 iOff;
          i64 iEnd;

          assert( pFile );
          assert( nDestTruncate==0 
              || (i64)nDestTruncate*(i64)pgszDest >= iSize || (
                nDestTruncate==(int)(PENDING_BYTE_PAGE(p->pDest->pBt)-1)
             && iSize>=PENDING_BYTE && iSize<=PENDING_BYTE+pgszDest
          ));

          /* This block ensures that all data required to recreate the original
          ** database has been stored in the journal for pDestPager and the
          ** journal synced to disk. So at this point we may safely modify
          ** the database file in any way, knowing that if a power failure
          ** occurs, the original database will be reconstructed from the 
          ** journal file.  */
          sqlite3PagerPagecount(pDestPager, &nDstPage);
          for(iPg=nDestTruncate; rc==SQLITE_OK && iPg<=(Pgno)nDstPage; iPg++){
            if( iPg!=PENDING_BYTE_PAGE(p->pDest->pBt) ){
              DbPage *pPg;
              rc = sqlite3PagerGet(pDestPager, iPg, &pPg, 0);
              if( rc==SQLITE_OK ){
                rc = sqlite3PagerWrite(pPg);
                sqlite3PagerUnref(pPg);
              }
            }
          }
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 1);
          }

          /* Write the extra pages and truncate the database file as required */
          iEnd = MIN(PENDING_BYTE + pgszDest, iSize);
          for(
            iOff=PENDING_BYTE+pgszSrc; 
            rc==SQLITE_OK && iOff<iEnd; 
            iOff+=pgszSrc
          ){
            PgHdr *pSrcPg = 0;
            const Pgno iSrcPg = (Pgno)((iOff/pgszSrc)+1);
            rc = sqlite3PagerGet(pSrcPager, iSrcPg, &pSrcPg, 0);
            if( rc==SQLITE_OK ){
              u8 *zData = sqlite3PagerGetData(pSrcPg);
              rc = sqlite3OsWrite(pFile, zData, pgszSrc, iOff);
            }
            sqlite3PagerUnref(pSrcPg);
          }
          if( rc==SQLITE_OK ){
            rc = backupTruncateFile(pFile, iSize);
          }

          /* Sync the database file to disk. */
          if( rc==SQLITE_OK ){
            rc = sqlite3PagerSync(pDestPager, 0);
          }
        }else{
          sqlite3PagerTruncateImage(pDestPager, nDestTruncate);
          rc = sqlite3PagerCommitPhaseOne(pDestPager, 0, 0);
        }
    
        /* Finish committing the transaction to the destination database. */
        if( SQLITE_OK==rc
         && SQLITE_OK==(rc = sqlite3BtreeCommitPhaseTwo(p->pDest, 0))
        ){
          rc = SQLITE_DONE;
        }
      }
    }
  
    /* If bCloseTrans is true, then this function opened a read transaction
    ** on the source database. Close the read transaction here. There is
    ** no need to check the return values of the btree methods here, as
    ** "committing" a read-only transaction cannot fail.
    */
    if( bCloseTrans ){
      TESTONLY( int rc2 );
      TESTONLY( rc2  = ) sqlite3BtreeCommitPhaseOne(p->pSrc, 0);
      TESTONLY( rc2 |= ) sqlite3BtreeCommitPhaseTwo(p->pSrc, 0);
      assert( rc2==SQLITE_OK );
    }
  
    if( rc==SQLITE_IOERR_NOMEM ){
      rc = SQLITE_NOMEM_BKPT;
    }
    p->rc = rc;
  }
  if( p->pDestDb ){
    sqlite3_mutex_leave(p->pDestDb->mutex);
  }
  sqlite3BtreeLeave(p->pSrc);
  sqlite3_mutex_leave(p->pSrcDb->mutex);
  return rc;
}